

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void do_test_tlsblock(size_t len_encoded,size_t max_bytes)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  byte bVar47;
  byte bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  long lVar57;
  undefined8 uVar58;
  ulong uVar59;
  size_t sVar60;
  long lVar61;
  ulong uVar62;
  uint8_t *puVar63;
  uint8_t *puVar64;
  size_t sVar65;
  undefined1 auVar66 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar108;
  int iVar109;
  undefined1 auVar104 [16];
  int iVar110;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar136;
  int iVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  ptls_buffer_t local_50;
  
  local_50.base = "";
  local_50.capacity = 0;
  local_50.off = 0;
  local_50.is_allocated = '\0';
  local_50.align_bits = '\0';
  iVar56 = ptls_buffer__do_pushv(&local_50,"",len_encoded);
  sVar60 = local_50.off;
  if (iVar56 == 0) {
    if (max_bytes != 0) {
      sVar65 = 0;
      do {
        iVar56 = ptls_buffer_reserve_aligned(&local_50,1,'\0');
        if (iVar56 != 0) goto LAB_001265f1;
        local_50.base[local_50.off] = (uint8_t)sVar65;
        local_50.off = local_50.off + 1;
        sVar65 = sVar65 + 1;
      } while (max_bytes != sVar65);
    }
    puVar64 = local_50.base;
    auVar55 = _DAT_001313e0;
    auVar54 = _DAT_001313d0;
    auVar53 = _DAT_001313c0;
    auVar52 = _DAT_001313b0;
    auVar51 = _DAT_001313a0;
    auVar50 = _DAT_00131230;
    auVar49 = _DAT_00131220;
    uVar59 = local_50.off - sVar60;
    bVar48 = (char)len_encoded * '\b';
    if (uVar59 >> (bVar48 & 0x3f) == 0) {
      if (len_encoded != 0) {
        lVar57 = len_encoded - 1;
        auVar106._8_4_ = (int)lVar57;
        auVar106._0_8_ = lVar57;
        auVar106._12_4_ = (int)((ulong)lVar57 >> 0x20);
        lVar57 = len_encoded * 8;
        lVar61 = sVar60 - len_encoded;
        uVar62 = 0;
        do {
          lVar57 = lVar57 + -0x80;
          auVar100._8_4_ = (int)uVar62;
          auVar100._0_8_ = uVar62;
          auVar100._12_4_ = (int)(uVar62 >> 0x20);
          auVar104 = auVar106 ^ auVar50;
          auVar111 = (auVar100 | auVar49) ^ auVar50;
          iVar56 = auVar104._0_4_;
          iVar136 = -(uint)(iVar56 < auVar111._0_4_);
          iVar108 = auVar104._4_4_;
          auVar113._4_4_ = -(uint)(iVar108 < auVar111._4_4_);
          iVar109 = auVar104._8_4_;
          iVar143 = -(uint)(iVar109 < auVar111._8_4_);
          iVar110 = auVar104._12_4_;
          auVar113._12_4_ = -(uint)(iVar110 < auVar111._12_4_);
          auVar67._4_4_ = iVar136;
          auVar67._0_4_ = iVar136;
          auVar67._8_4_ = iVar143;
          auVar67._12_4_ = iVar143;
          auVar67 = pshuflw(in_XMM1,auVar67,0xe8);
          auVar112._4_4_ = -(uint)(auVar111._4_4_ == iVar108);
          auVar112._12_4_ = -(uint)(auVar111._12_4_ == iVar110);
          auVar112._0_4_ = auVar112._4_4_;
          auVar112._8_4_ = auVar112._12_4_;
          auVar85 = pshuflw(in_XMM2,auVar112,0xe8);
          auVar113._0_4_ = auVar113._4_4_;
          auVar113._8_4_ = auVar113._12_4_;
          auVar111 = pshuflw(auVar67,auVar113,0xe8);
          auVar104._8_4_ = 0xffffffff;
          auVar104._0_8_ = 0xffffffffffffffff;
          auVar104._12_4_ = 0xffffffff;
          auVar104 = (auVar111 | auVar85 & auVar67) ^ auVar104;
          auVar104 = packssdw(auVar104,auVar104);
          bVar47 = (byte)lVar57;
          if ((auVar104 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61] = (uint8_t)(uVar59 >> (bVar47 + 0x78 & 0x3f));
          }
          auVar85._4_4_ = iVar136;
          auVar85._0_4_ = iVar136;
          auVar85._8_4_ = iVar143;
          auVar85._12_4_ = iVar143;
          auVar113 = auVar112 & auVar85 | auVar113;
          auVar104 = packssdw(auVar113,auVar113);
          auVar111._8_4_ = 0xffffffff;
          auVar111._0_8_ = 0xffffffffffffffff;
          auVar111._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar111,auVar104 ^ auVar111);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._0_4_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 1] = (uint8_t)(uVar59 >> (bVar47 + 0x70 & 0x3f));
          }
          auVar104 = (auVar100 | auVar55) ^ auVar50;
          auVar86._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar86._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar86._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar86._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar114._4_4_ = auVar86._0_4_;
          auVar114._0_4_ = auVar86._0_4_;
          auVar114._8_4_ = auVar86._8_4_;
          auVar114._12_4_ = auVar86._8_4_;
          iVar136 = -(uint)(auVar104._4_4_ == iVar108);
          iVar143 = -(uint)(auVar104._12_4_ == iVar110);
          auVar21._4_4_ = iVar136;
          auVar21._0_4_ = iVar136;
          auVar21._8_4_ = iVar143;
          auVar21._12_4_ = iVar143;
          auVar137._4_4_ = auVar86._4_4_;
          auVar137._0_4_ = auVar86._4_4_;
          auVar137._8_4_ = auVar86._12_4_;
          auVar137._12_4_ = auVar86._12_4_;
          auVar104 = auVar21 & auVar114 | auVar137;
          auVar104 = packssdw(auVar104,auVar104);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar2,auVar104 ^ auVar2);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._0_4_ >> 0x10 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 2] = (uint8_t)(uVar59 >> (bVar47 + 0x68 & 0x3f));
          }
          auVar104 = pshufhw(auVar104,auVar114,0x84);
          auVar22._4_4_ = iVar136;
          auVar22._0_4_ = iVar136;
          auVar22._8_4_ = iVar143;
          auVar22._12_4_ = iVar143;
          auVar111 = pshufhw(auVar86,auVar22,0x84);
          auVar67 = pshufhw(auVar104,auVar137,0x84);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          auVar68 = (auVar67 | auVar111 & auVar104) ^ auVar68;
          auVar104 = packssdw(auVar68,auVar68);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._0_4_ >> 0x18 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 3] = (uint8_t)(uVar59 >> (bVar47 + 0x60 & 0x3f));
          }
          auVar104 = (auVar100 | auVar54) ^ auVar50;
          auVar87._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar87._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar87._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar87._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar23._4_4_ = auVar87._0_4_;
          auVar23._0_4_ = auVar87._0_4_;
          auVar23._8_4_ = auVar87._8_4_;
          auVar23._12_4_ = auVar87._8_4_;
          auVar111 = pshuflw(auVar137,auVar23,0xe8);
          auVar69._0_4_ = -(uint)(auVar104._0_4_ == iVar56);
          auVar69._4_4_ = -(uint)(auVar104._4_4_ == iVar108);
          auVar69._8_4_ = -(uint)(auVar104._8_4_ == iVar109);
          auVar69._12_4_ = -(uint)(auVar104._12_4_ == iVar110);
          auVar115._4_4_ = auVar69._4_4_;
          auVar115._0_4_ = auVar69._4_4_;
          auVar115._8_4_ = auVar69._12_4_;
          auVar115._12_4_ = auVar69._12_4_;
          auVar104 = pshuflw(auVar69,auVar115,0xe8);
          auVar116._4_4_ = auVar87._4_4_;
          auVar116._0_4_ = auVar87._4_4_;
          auVar116._8_4_ = auVar87._12_4_;
          auVar116._12_4_ = auVar87._12_4_;
          auVar67 = pshuflw(auVar87,auVar116,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 & auVar111,(auVar67 | auVar104 & auVar111) ^ auVar3);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61 + 4] = (uint8_t)(uVar59 >> (bVar47 + 0x58 & 0x3f));
          }
          auVar24._4_4_ = auVar87._0_4_;
          auVar24._0_4_ = auVar87._0_4_;
          auVar24._8_4_ = auVar87._8_4_;
          auVar24._12_4_ = auVar87._8_4_;
          auVar116 = auVar115 & auVar24 | auVar116;
          auVar67 = packssdw(auVar116,auVar116);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104,auVar67 ^ auVar4);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._4_2_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 5] = (uint8_t)(uVar59 >> (bVar47 + 0x50 & 0x3f));
          }
          auVar104 = (auVar100 | auVar53) ^ auVar50;
          auVar88._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar88._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar88._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar88._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar117._4_4_ = auVar88._0_4_;
          auVar117._0_4_ = auVar88._0_4_;
          auVar117._8_4_ = auVar88._8_4_;
          auVar117._12_4_ = auVar88._8_4_;
          iVar136 = -(uint)(auVar104._4_4_ == iVar108);
          iVar143 = -(uint)(auVar104._12_4_ == iVar110);
          auVar25._4_4_ = iVar136;
          auVar25._0_4_ = iVar136;
          auVar25._8_4_ = iVar143;
          auVar25._12_4_ = iVar143;
          auVar138._4_4_ = auVar88._4_4_;
          auVar138._0_4_ = auVar88._4_4_;
          auVar138._8_4_ = auVar88._12_4_;
          auVar138._12_4_ = auVar88._12_4_;
          auVar104 = auVar25 & auVar117 | auVar138;
          auVar104 = packssdw(auVar104,auVar104);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar5,auVar104 ^ auVar5);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61 + 6] = (uint8_t)(uVar59 >> (bVar47 + 0x48 & 0x3f));
          }
          auVar104 = pshufhw(auVar104,auVar117,0x84);
          auVar26._4_4_ = iVar136;
          auVar26._0_4_ = iVar136;
          auVar26._8_4_ = iVar143;
          auVar26._12_4_ = iVar143;
          auVar111 = pshufhw(auVar88,auVar26,0x84);
          auVar67 = pshufhw(auVar104,auVar138,0x84);
          auVar70._8_4_ = 0xffffffff;
          auVar70._0_8_ = 0xffffffffffffffff;
          auVar70._12_4_ = 0xffffffff;
          auVar70 = (auVar67 | auVar111 & auVar104) ^ auVar70;
          auVar104 = packssdw(auVar70,auVar70);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._6_2_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 7] = (uint8_t)(uVar59 >> (bVar47 & 0x3f));
          }
          auVar104 = (auVar100 | auVar52) ^ auVar50;
          auVar89._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar89._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar89._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar89._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar27._4_4_ = auVar89._0_4_;
          auVar27._0_4_ = auVar89._0_4_;
          auVar27._8_4_ = auVar89._8_4_;
          auVar27._12_4_ = auVar89._8_4_;
          auVar111 = pshuflw(auVar138,auVar27,0xe8);
          auVar71._0_4_ = -(uint)(auVar104._0_4_ == iVar56);
          auVar71._4_4_ = -(uint)(auVar104._4_4_ == iVar108);
          auVar71._8_4_ = -(uint)(auVar104._8_4_ == iVar109);
          auVar71._12_4_ = -(uint)(auVar104._12_4_ == iVar110);
          auVar118._4_4_ = auVar71._4_4_;
          auVar118._0_4_ = auVar71._4_4_;
          auVar118._8_4_ = auVar71._12_4_;
          auVar118._12_4_ = auVar71._12_4_;
          auVar104 = pshuflw(auVar71,auVar118,0xe8);
          auVar119._4_4_ = auVar89._4_4_;
          auVar119._0_4_ = auVar89._4_4_;
          auVar119._8_4_ = auVar89._12_4_;
          auVar119._12_4_ = auVar89._12_4_;
          auVar67 = pshuflw(auVar89,auVar119,0xe8);
          auVar90._8_4_ = 0xffffffff;
          auVar90._0_8_ = 0xffffffffffffffff;
          auVar90._12_4_ = 0xffffffff;
          auVar90 = (auVar67 | auVar104 & auVar111) ^ auVar90;
          auVar67 = packssdw(auVar90,auVar90);
          auVar104 = packsswb(auVar104 & auVar111,auVar67);
          if ((auVar104 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61 + 8] = (uint8_t)(uVar59 >> (bVar47 + 0x38 & 0x3f));
          }
          auVar28._4_4_ = auVar89._0_4_;
          auVar28._0_4_ = auVar89._0_4_;
          auVar28._8_4_ = auVar89._8_4_;
          auVar28._12_4_ = auVar89._8_4_;
          auVar119 = auVar118 & auVar28 | auVar119;
          auVar67 = packssdw(auVar119,auVar119);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar6,auVar67 ^ auVar6);
          auVar104 = packsswb(auVar104,auVar67);
          if ((auVar104._8_2_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 9] = (uint8_t)(uVar59 >> (bVar47 + 0x30 & 0x3f));
          }
          auVar104 = (auVar100 | auVar51) ^ auVar50;
          auVar91._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar91._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar91._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar91._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar120._4_4_ = auVar91._0_4_;
          auVar120._0_4_ = auVar91._0_4_;
          auVar120._8_4_ = auVar91._8_4_;
          auVar120._12_4_ = auVar91._8_4_;
          iVar136 = -(uint)(auVar104._4_4_ == iVar108);
          iVar143 = -(uint)(auVar104._12_4_ == iVar110);
          auVar29._4_4_ = iVar136;
          auVar29._0_4_ = iVar136;
          auVar29._8_4_ = iVar143;
          auVar29._12_4_ = iVar143;
          auVar139._4_4_ = auVar91._4_4_;
          auVar139._0_4_ = auVar91._4_4_;
          auVar139._8_4_ = auVar91._12_4_;
          auVar139._12_4_ = auVar91._12_4_;
          auVar104 = auVar29 & auVar120 | auVar139;
          auVar104 = packssdw(auVar104,auVar104);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar7,auVar104 ^ auVar7);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61 + 10] = (uint8_t)(uVar59 >> (bVar47 + 0x28 & 0x3f));
          }
          auVar104 = pshufhw(auVar104,auVar120,0x84);
          auVar30._4_4_ = iVar136;
          auVar30._0_4_ = iVar136;
          auVar30._8_4_ = iVar143;
          auVar30._12_4_ = iVar143;
          auVar111 = pshufhw(auVar91,auVar30,0x84);
          auVar67 = pshufhw(auVar104,auVar139,0x84);
          auVar72._8_4_ = 0xffffffff;
          auVar72._0_8_ = 0xffffffffffffffff;
          auVar72._12_4_ = 0xffffffff;
          auVar72 = (auVar67 | auVar111 & auVar104) ^ auVar72;
          auVar104 = packssdw(auVar72,auVar72);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._10_2_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 0xb] = (uint8_t)(uVar59 >> (bVar47 + 0x20 & 0x3f));
          }
          auVar104 = (auVar100 | _DAT_00131390) ^ auVar50;
          auVar92._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar92._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar92._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar92._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar31._4_4_ = auVar92._0_4_;
          auVar31._0_4_ = auVar92._0_4_;
          auVar31._8_4_ = auVar92._8_4_;
          auVar31._12_4_ = auVar92._8_4_;
          auVar111 = pshuflw(auVar139,auVar31,0xe8);
          auVar73._0_4_ = -(uint)(auVar104._0_4_ == iVar56);
          auVar73._4_4_ = -(uint)(auVar104._4_4_ == iVar108);
          auVar73._8_4_ = -(uint)(auVar104._8_4_ == iVar109);
          auVar73._12_4_ = -(uint)(auVar104._12_4_ == iVar110);
          auVar121._4_4_ = auVar73._4_4_;
          auVar121._0_4_ = auVar73._4_4_;
          auVar121._8_4_ = auVar73._12_4_;
          auVar121._12_4_ = auVar73._12_4_;
          auVar104 = pshuflw(auVar73,auVar121,0xe8);
          auVar122._4_4_ = auVar92._4_4_;
          auVar122._0_4_ = auVar92._4_4_;
          auVar122._8_4_ = auVar92._12_4_;
          auVar122._12_4_ = auVar92._12_4_;
          auVar67 = pshuflw(auVar92,auVar122,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 & auVar111,(auVar67 | auVar104 & auVar111) ^ auVar8);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61 + 0xc] = (uint8_t)(uVar59 >> (bVar47 + 0x18 & 0x3f));
          }
          auVar32._4_4_ = auVar92._0_4_;
          auVar32._0_4_ = auVar92._0_4_;
          auVar32._8_4_ = auVar92._8_4_;
          auVar32._12_4_ = auVar92._8_4_;
          auVar122 = auVar121 & auVar32 | auVar122;
          auVar67 = packssdw(auVar122,auVar122);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104,auVar67 ^ auVar9);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._12_2_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 0xd] = (uint8_t)(uVar59 >> (bVar47 + 0x10 & 0x3f));
          }
          auVar104 = (auVar100 | _DAT_00131380) ^ auVar50;
          auVar74._0_4_ = -(uint)(iVar56 < auVar104._0_4_);
          auVar74._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
          auVar74._8_4_ = -(uint)(iVar109 < auVar104._8_4_);
          auVar74._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
          auVar123._4_4_ = auVar74._0_4_;
          auVar123._0_4_ = auVar74._0_4_;
          auVar123._8_4_ = auVar74._8_4_;
          auVar123._12_4_ = auVar74._8_4_;
          auVar101._4_4_ = -(uint)(auVar104._4_4_ == iVar108);
          auVar101._12_4_ = -(uint)(auVar104._12_4_ == iVar110);
          auVar101._0_4_ = auVar101._4_4_;
          auVar101._8_4_ = auVar101._12_4_;
          auVar105._4_4_ = auVar74._4_4_;
          auVar105._0_4_ = auVar74._4_4_;
          auVar105._8_4_ = auVar74._12_4_;
          auVar105._12_4_ = auVar74._12_4_;
          auVar67 = auVar101 & auVar123 | auVar105;
          auVar104 = packssdw(auVar74,auVar67);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar10,auVar104 ^ auVar10);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_50.base[uVar62 + lVar61 + 0xe] = (uint8_t)(uVar59 >> (bVar47 + 8 & 0x3f));
          }
          auVar104 = pshufhw(auVar104,auVar123,0x84);
          in_XMM2 = pshufhw(auVar67,auVar101,0x84);
          in_XMM2 = in_XMM2 & auVar104;
          auVar104 = pshufhw(auVar104,auVar105,0x84);
          auVar75._8_4_ = 0xffffffff;
          auVar75._0_8_ = 0xffffffffffffffff;
          auVar75._12_4_ = 0xffffffff;
          auVar75 = (auVar104 | in_XMM2) ^ auVar75;
          auVar104 = packssdw(auVar75,auVar75);
          in_XMM1 = packsswb(auVar104,auVar104);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            local_50.base[uVar62 + lVar61 + 0xf] = (uint8_t)(uVar59 >> (bVar47 & 0x3f));
          }
          uVar62 = uVar62 + 0x10;
        } while ((len_encoded + 0xf & 0xfffffffffffffff0) != uVar62);
      }
      if (len_encoded <= local_50.off) {
        puVar63 = local_50.base + local_50.off;
        sVar60 = 0;
        uVar59 = 0;
        do {
          uVar59 = (ulong)local_50.base[sVar60] | uVar59 << 8;
          sVar60 = sVar60 + 1;
        } while (len_encoded != sVar60);
        if (uVar59 <= local_50.off - len_encoded) {
          puVar1 = local_50.base + uVar59 + len_encoded;
          _ok((uint)(uVar59 == max_bytes),"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x874);
          iVar56 = 1;
          if (max_bytes != 0) {
            sVar60 = 0;
            iVar56 = 1;
            do {
              if ((uint8_t)sVar60 != puVar64[sVar60 + len_encoded]) {
                iVar56 = 0;
              }
              sVar60 = sVar60 + 1;
            } while (max_bytes != sVar60);
          }
          _ok(iVar56,"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x87a);
          if (puVar1 == puVar63) {
            iVar56 = ptls_buffer__do_pushv(&local_50,"",len_encoded);
            sVar60 = local_50.off;
            if (iVar56 == 0) {
              lVar57 = max_bytes + 1;
              do {
                iVar56 = ptls_buffer_reserve_aligned(&local_50,1,'\0');
                puVar64 = local_50.base;
                if (iVar56 != 0) goto LAB_001265f1;
                local_50.base[local_50.off] = '\x01';
                auVar55 = _DAT_001313e0;
                auVar54 = _DAT_001313d0;
                auVar53 = _DAT_001313c0;
                auVar52 = _DAT_001313b0;
                auVar51 = _DAT_001313a0;
                auVar50 = _DAT_00131230;
                auVar49 = _DAT_00131220;
                sVar65 = local_50.off + 1;
                lVar57 = lVar57 + -1;
                local_50.off = sVar65;
              } while (lVar57 != 0);
              uVar59 = sVar65 - sVar60;
              if (uVar59 >> (bVar48 & 0x3f) == 0) {
                if (len_encoded != 0) {
                  lVar57 = len_encoded - 1;
                  auVar66._8_4_ = (int)lVar57;
                  auVar66._0_8_ = lVar57;
                  auVar66._12_4_ = (int)((ulong)lVar57 >> 0x20);
                  lVar57 = len_encoded * 8;
                  lVar61 = sVar60 - len_encoded;
                  uVar62 = 0;
                  do {
                    lVar57 = lVar57 + -0x80;
                    auVar102._8_4_ = (int)uVar62;
                    auVar102._0_8_ = uVar62;
                    auVar102._12_4_ = (int)(uVar62 >> 0x20);
                    auVar106 = auVar66 ^ auVar50;
                    auVar104 = (auVar102 | auVar49) ^ auVar50;
                    iVar56 = auVar106._0_4_;
                    iVar136 = -(uint)(iVar56 < auVar104._0_4_);
                    iVar108 = auVar106._4_4_;
                    auVar125._4_4_ = -(uint)(iVar108 < auVar104._4_4_);
                    iVar109 = auVar106._8_4_;
                    iVar143 = -(uint)(iVar109 < auVar104._8_4_);
                    iVar110 = auVar106._12_4_;
                    auVar125._12_4_ = -(uint)(iVar110 < auVar104._12_4_);
                    auVar33._4_4_ = iVar136;
                    auVar33._0_4_ = iVar136;
                    auVar33._8_4_ = iVar143;
                    auVar33._12_4_ = iVar143;
                    auVar106 = pshuflw(in_XMM1,auVar33,0xe8);
                    auVar124._4_4_ = -(uint)(auVar104._4_4_ == iVar108);
                    auVar124._12_4_ = -(uint)(auVar104._12_4_ == iVar110);
                    auVar124._0_4_ = auVar124._4_4_;
                    auVar124._8_4_ = auVar124._12_4_;
                    auVar67 = pshuflw(in_XMM2,auVar124,0xe8);
                    auVar125._0_4_ = auVar125._4_4_;
                    auVar125._8_4_ = auVar125._12_4_;
                    auVar104 = pshuflw(auVar106,auVar125,0xe8);
                    auVar76._8_4_ = 0xffffffff;
                    auVar76._0_8_ = 0xffffffffffffffff;
                    auVar76._12_4_ = 0xffffffff;
                    auVar76 = (auVar104 | auVar67 & auVar106) ^ auVar76;
                    auVar106 = packssdw(auVar76,auVar76);
                    bVar48 = (byte)lVar57;
                    if ((auVar106 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61] = (uint8_t)(uVar59 >> (bVar48 + 0x78 & 0x3f));
                    }
                    auVar34._4_4_ = iVar136;
                    auVar34._0_4_ = iVar136;
                    auVar34._8_4_ = iVar143;
                    auVar34._12_4_ = iVar143;
                    auVar125 = auVar124 & auVar34 | auVar125;
                    auVar106 = packssdw(auVar125,auVar125);
                    auVar11._8_4_ = 0xffffffff;
                    auVar11._0_8_ = 0xffffffffffffffff;
                    auVar11._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 ^ auVar11,auVar106 ^ auVar11);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._0_4_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 1] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x70 & 0x3f));
                    }
                    auVar106 = (auVar102 | auVar55) ^ auVar50;
                    auVar93._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar93._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar93._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar93._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar126._4_4_ = auVar93._0_4_;
                    auVar126._0_4_ = auVar93._0_4_;
                    auVar126._8_4_ = auVar93._8_4_;
                    auVar126._12_4_ = auVar93._8_4_;
                    iVar136 = -(uint)(auVar106._4_4_ == iVar108);
                    iVar143 = -(uint)(auVar106._12_4_ == iVar110);
                    auVar35._4_4_ = iVar136;
                    auVar35._0_4_ = iVar136;
                    auVar35._8_4_ = iVar143;
                    auVar35._12_4_ = iVar143;
                    auVar140._4_4_ = auVar93._4_4_;
                    auVar140._0_4_ = auVar93._4_4_;
                    auVar140._8_4_ = auVar93._12_4_;
                    auVar140._12_4_ = auVar93._12_4_;
                    auVar106 = auVar35 & auVar126 | auVar140;
                    auVar106 = packssdw(auVar106,auVar106);
                    auVar12._8_4_ = 0xffffffff;
                    auVar12._0_8_ = 0xffffffffffffffff;
                    auVar12._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 ^ auVar12,auVar106 ^ auVar12);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._0_4_ >> 0x10 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 2] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x68 & 0x3f));
                    }
                    auVar106 = pshufhw(auVar106,auVar126,0x84);
                    auVar36._4_4_ = iVar136;
                    auVar36._0_4_ = iVar136;
                    auVar36._8_4_ = iVar143;
                    auVar36._12_4_ = iVar143;
                    auVar67 = pshufhw(auVar93,auVar36,0x84);
                    auVar104 = pshufhw(auVar106,auVar140,0x84);
                    auVar77._8_4_ = 0xffffffff;
                    auVar77._0_8_ = 0xffffffffffffffff;
                    auVar77._12_4_ = 0xffffffff;
                    auVar77 = (auVar104 | auVar67 & auVar106) ^ auVar77;
                    auVar106 = packssdw(auVar77,auVar77);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._0_4_ >> 0x18 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 3] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x60 & 0x3f));
                    }
                    auVar106 = (auVar102 | auVar54) ^ auVar50;
                    auVar94._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar94._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar94._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar94._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar37._4_4_ = auVar94._0_4_;
                    auVar37._0_4_ = auVar94._0_4_;
                    auVar37._8_4_ = auVar94._8_4_;
                    auVar37._12_4_ = auVar94._8_4_;
                    auVar67 = pshuflw(auVar140,auVar37,0xe8);
                    auVar78._0_4_ = -(uint)(auVar106._0_4_ == iVar56);
                    auVar78._4_4_ = -(uint)(auVar106._4_4_ == iVar108);
                    auVar78._8_4_ = -(uint)(auVar106._8_4_ == iVar109);
                    auVar78._12_4_ = -(uint)(auVar106._12_4_ == iVar110);
                    auVar127._4_4_ = auVar78._4_4_;
                    auVar127._0_4_ = auVar78._4_4_;
                    auVar127._8_4_ = auVar78._12_4_;
                    auVar127._12_4_ = auVar78._12_4_;
                    auVar106 = pshuflw(auVar78,auVar127,0xe8);
                    auVar128._4_4_ = auVar94._4_4_;
                    auVar128._0_4_ = auVar94._4_4_;
                    auVar128._8_4_ = auVar94._12_4_;
                    auVar128._12_4_ = auVar94._12_4_;
                    auVar104 = pshuflw(auVar94,auVar128,0xe8);
                    auVar13._8_4_ = 0xffffffff;
                    auVar13._0_8_ = 0xffffffffffffffff;
                    auVar13._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 & auVar67,(auVar104 | auVar106 & auVar67) ^ auVar13
                                       );
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61 + 4] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x58 & 0x3f));
                    }
                    auVar38._4_4_ = auVar94._0_4_;
                    auVar38._0_4_ = auVar94._0_4_;
                    auVar38._8_4_ = auVar94._8_4_;
                    auVar38._12_4_ = auVar94._8_4_;
                    auVar128 = auVar127 & auVar38 | auVar128;
                    auVar104 = packssdw(auVar128,auVar128);
                    auVar14._8_4_ = 0xffffffff;
                    auVar14._0_8_ = 0xffffffffffffffff;
                    auVar14._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106,auVar104 ^ auVar14);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._4_2_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 5] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x50 & 0x3f));
                    }
                    auVar106 = (auVar102 | auVar53) ^ auVar50;
                    auVar95._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar95._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar95._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar95._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar129._4_4_ = auVar95._0_4_;
                    auVar129._0_4_ = auVar95._0_4_;
                    auVar129._8_4_ = auVar95._8_4_;
                    auVar129._12_4_ = auVar95._8_4_;
                    iVar136 = -(uint)(auVar106._4_4_ == iVar108);
                    iVar143 = -(uint)(auVar106._12_4_ == iVar110);
                    auVar39._4_4_ = iVar136;
                    auVar39._0_4_ = iVar136;
                    auVar39._8_4_ = iVar143;
                    auVar39._12_4_ = iVar143;
                    auVar141._4_4_ = auVar95._4_4_;
                    auVar141._0_4_ = auVar95._4_4_;
                    auVar141._8_4_ = auVar95._12_4_;
                    auVar141._12_4_ = auVar95._12_4_;
                    auVar106 = auVar39 & auVar129 | auVar141;
                    auVar106 = packssdw(auVar106,auVar106);
                    auVar15._8_4_ = 0xffffffff;
                    auVar15._0_8_ = 0xffffffffffffffff;
                    auVar15._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 ^ auVar15,auVar106 ^ auVar15);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61 + 6] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x48 & 0x3f));
                    }
                    auVar106 = pshufhw(auVar106,auVar129,0x84);
                    auVar40._4_4_ = iVar136;
                    auVar40._0_4_ = iVar136;
                    auVar40._8_4_ = iVar143;
                    auVar40._12_4_ = iVar143;
                    auVar67 = pshufhw(auVar95,auVar40,0x84);
                    auVar104 = pshufhw(auVar106,auVar141,0x84);
                    auVar79._8_4_ = 0xffffffff;
                    auVar79._0_8_ = 0xffffffffffffffff;
                    auVar79._12_4_ = 0xffffffff;
                    auVar79 = (auVar104 | auVar67 & auVar106) ^ auVar79;
                    auVar106 = packssdw(auVar79,auVar79);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._6_2_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 7] = (uint8_t)(uVar59 >> (bVar48 & 0x3f));
                    }
                    auVar106 = (auVar102 | auVar52) ^ auVar50;
                    auVar96._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar96._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar96._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar96._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar41._4_4_ = auVar96._0_4_;
                    auVar41._0_4_ = auVar96._0_4_;
                    auVar41._8_4_ = auVar96._8_4_;
                    auVar41._12_4_ = auVar96._8_4_;
                    auVar67 = pshuflw(auVar141,auVar41,0xe8);
                    auVar80._0_4_ = -(uint)(auVar106._0_4_ == iVar56);
                    auVar80._4_4_ = -(uint)(auVar106._4_4_ == iVar108);
                    auVar80._8_4_ = -(uint)(auVar106._8_4_ == iVar109);
                    auVar80._12_4_ = -(uint)(auVar106._12_4_ == iVar110);
                    auVar130._4_4_ = auVar80._4_4_;
                    auVar130._0_4_ = auVar80._4_4_;
                    auVar130._8_4_ = auVar80._12_4_;
                    auVar130._12_4_ = auVar80._12_4_;
                    auVar106 = pshuflw(auVar80,auVar130,0xe8);
                    auVar131._4_4_ = auVar96._4_4_;
                    auVar131._0_4_ = auVar96._4_4_;
                    auVar131._8_4_ = auVar96._12_4_;
                    auVar131._12_4_ = auVar96._12_4_;
                    auVar104 = pshuflw(auVar96,auVar131,0xe8);
                    auVar97._8_4_ = 0xffffffff;
                    auVar97._0_8_ = 0xffffffffffffffff;
                    auVar97._12_4_ = 0xffffffff;
                    auVar97 = (auVar104 | auVar106 & auVar67) ^ auVar97;
                    auVar104 = packssdw(auVar97,auVar97);
                    auVar106 = packsswb(auVar106 & auVar67,auVar104);
                    if ((auVar106 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61 + 8] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x38 & 0x3f));
                    }
                    auVar42._4_4_ = auVar96._0_4_;
                    auVar42._0_4_ = auVar96._0_4_;
                    auVar42._8_4_ = auVar96._8_4_;
                    auVar42._12_4_ = auVar96._8_4_;
                    auVar131 = auVar130 & auVar42 | auVar131;
                    auVar104 = packssdw(auVar131,auVar131);
                    auVar16._8_4_ = 0xffffffff;
                    auVar16._0_8_ = 0xffffffffffffffff;
                    auVar16._12_4_ = 0xffffffff;
                    auVar104 = packssdw(auVar104 ^ auVar16,auVar104 ^ auVar16);
                    auVar106 = packsswb(auVar106,auVar104);
                    if ((auVar106._8_2_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 9] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x30 & 0x3f));
                    }
                    auVar106 = (auVar102 | auVar51) ^ auVar50;
                    auVar98._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar98._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar98._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar98._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar132._4_4_ = auVar98._0_4_;
                    auVar132._0_4_ = auVar98._0_4_;
                    auVar132._8_4_ = auVar98._8_4_;
                    auVar132._12_4_ = auVar98._8_4_;
                    iVar136 = -(uint)(auVar106._4_4_ == iVar108);
                    iVar143 = -(uint)(auVar106._12_4_ == iVar110);
                    auVar43._4_4_ = iVar136;
                    auVar43._0_4_ = iVar136;
                    auVar43._8_4_ = iVar143;
                    auVar43._12_4_ = iVar143;
                    auVar142._4_4_ = auVar98._4_4_;
                    auVar142._0_4_ = auVar98._4_4_;
                    auVar142._8_4_ = auVar98._12_4_;
                    auVar142._12_4_ = auVar98._12_4_;
                    auVar106 = auVar43 & auVar132 | auVar142;
                    auVar106 = packssdw(auVar106,auVar106);
                    auVar17._8_4_ = 0xffffffff;
                    auVar17._0_8_ = 0xffffffffffffffff;
                    auVar17._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 ^ auVar17,auVar106 ^ auVar17);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61 + 10] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x28 & 0x3f));
                    }
                    auVar106 = pshufhw(auVar106,auVar132,0x84);
                    auVar44._4_4_ = iVar136;
                    auVar44._0_4_ = iVar136;
                    auVar44._8_4_ = iVar143;
                    auVar44._12_4_ = iVar143;
                    auVar67 = pshufhw(auVar98,auVar44,0x84);
                    auVar104 = pshufhw(auVar106,auVar142,0x84);
                    auVar81._8_4_ = 0xffffffff;
                    auVar81._0_8_ = 0xffffffffffffffff;
                    auVar81._12_4_ = 0xffffffff;
                    auVar81 = (auVar104 | auVar67 & auVar106) ^ auVar81;
                    auVar106 = packssdw(auVar81,auVar81);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._10_2_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 0xb] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x20 & 0x3f));
                    }
                    auVar106 = (auVar102 | _DAT_00131390) ^ auVar50;
                    auVar99._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar99._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar99._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar99._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar45._4_4_ = auVar99._0_4_;
                    auVar45._0_4_ = auVar99._0_4_;
                    auVar45._8_4_ = auVar99._8_4_;
                    auVar45._12_4_ = auVar99._8_4_;
                    auVar67 = pshuflw(auVar142,auVar45,0xe8);
                    auVar82._0_4_ = -(uint)(auVar106._0_4_ == iVar56);
                    auVar82._4_4_ = -(uint)(auVar106._4_4_ == iVar108);
                    auVar82._8_4_ = -(uint)(auVar106._8_4_ == iVar109);
                    auVar82._12_4_ = -(uint)(auVar106._12_4_ == iVar110);
                    auVar133._4_4_ = auVar82._4_4_;
                    auVar133._0_4_ = auVar82._4_4_;
                    auVar133._8_4_ = auVar82._12_4_;
                    auVar133._12_4_ = auVar82._12_4_;
                    auVar106 = pshuflw(auVar82,auVar133,0xe8);
                    auVar134._4_4_ = auVar99._4_4_;
                    auVar134._0_4_ = auVar99._4_4_;
                    auVar134._8_4_ = auVar99._12_4_;
                    auVar134._12_4_ = auVar99._12_4_;
                    auVar104 = pshuflw(auVar99,auVar134,0xe8);
                    auVar18._8_4_ = 0xffffffff;
                    auVar18._0_8_ = 0xffffffffffffffff;
                    auVar18._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 & auVar67,(auVar104 | auVar106 & auVar67) ^ auVar18
                                       );
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61 + 0xc] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x18 & 0x3f));
                    }
                    auVar46._4_4_ = auVar99._0_4_;
                    auVar46._0_4_ = auVar99._0_4_;
                    auVar46._8_4_ = auVar99._8_4_;
                    auVar46._12_4_ = auVar99._8_4_;
                    auVar134 = auVar133 & auVar46 | auVar134;
                    auVar104 = packssdw(auVar134,auVar134);
                    auVar19._8_4_ = 0xffffffff;
                    auVar19._0_8_ = 0xffffffffffffffff;
                    auVar19._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106,auVar104 ^ auVar19);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106._12_2_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 0xd] =
                           (uint8_t)(uVar59 >> (bVar48 + 0x10 & 0x3f));
                    }
                    auVar106 = (auVar102 | _DAT_00131380) ^ auVar50;
                    auVar83._0_4_ = -(uint)(iVar56 < auVar106._0_4_);
                    auVar83._4_4_ = -(uint)(iVar108 < auVar106._4_4_);
                    auVar83._8_4_ = -(uint)(iVar109 < auVar106._8_4_);
                    auVar83._12_4_ = -(uint)(iVar110 < auVar106._12_4_);
                    auVar135._4_4_ = auVar83._0_4_;
                    auVar135._0_4_ = auVar83._0_4_;
                    auVar135._8_4_ = auVar83._8_4_;
                    auVar135._12_4_ = auVar83._8_4_;
                    auVar103._4_4_ = -(uint)(auVar106._4_4_ == iVar108);
                    auVar103._12_4_ = -(uint)(auVar106._12_4_ == iVar110);
                    auVar103._0_4_ = auVar103._4_4_;
                    auVar103._8_4_ = auVar103._12_4_;
                    auVar107._4_4_ = auVar83._4_4_;
                    auVar107._0_4_ = auVar83._4_4_;
                    auVar107._8_4_ = auVar83._12_4_;
                    auVar107._12_4_ = auVar83._12_4_;
                    auVar104 = auVar103 & auVar135 | auVar107;
                    auVar106 = packssdw(auVar83,auVar104);
                    auVar20._8_4_ = 0xffffffff;
                    auVar20._0_8_ = 0xffffffffffffffff;
                    auVar20._12_4_ = 0xffffffff;
                    auVar106 = packssdw(auVar106 ^ auVar20,auVar106 ^ auVar20);
                    auVar106 = packsswb(auVar106,auVar106);
                    if ((auVar106 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      local_50.base[uVar62 + lVar61 + 0xe] =
                           (uint8_t)(uVar59 >> (bVar48 + 8 & 0x3f));
                    }
                    auVar106 = pshufhw(auVar106,auVar135,0x84);
                    in_XMM2 = pshufhw(auVar104,auVar103,0x84);
                    in_XMM2 = in_XMM2 & auVar106;
                    auVar106 = pshufhw(auVar106,auVar107,0x84);
                    auVar84._8_4_ = 0xffffffff;
                    auVar84._0_8_ = 0xffffffffffffffff;
                    auVar84._12_4_ = 0xffffffff;
                    auVar84 = (auVar106 | in_XMM2) ^ auVar84;
                    auVar106 = packssdw(auVar84,auVar84);
                    in_XMM1 = packsswb(auVar106,auVar106);
                    if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                      local_50.base[uVar62 + lVar61 + 0xf] = (uint8_t)(uVar59 >> (bVar48 & 0x3f));
                    }
                    uVar62 = uVar62 + 0x10;
                  } while ((len_encoded + 0xf & 0xfffffffffffffff0) != uVar62);
                }
                iVar56 = 0;
                uVar58 = 0x884;
              }
              else {
                iVar56 = 1;
                uVar58 = 0x889;
              }
              _ok(iVar56,"%s %d",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                  uVar58);
              goto LAB_00126617;
            }
          }
        }
      }
    }
  }
LAB_001265f1:
  _ok(0,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x88b)
  ;
  puVar64 = local_50.base;
  sVar65 = local_50.off;
LAB_00126617:
  (*ptls_clear_memory)(puVar64,sVar65);
  if (local_50.is_allocated != '\0') {
    free(puVar64);
    return;
  }
  return;
}

Assistant:

static void do_test_tlsblock(size_t len_encoded, size_t max_bytes)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int expect_overflow = 0, ret;

    /* block that fits in */
    ptls_buffer_init(&buf, "", 0);
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes; ++i)
            ptls_buffer_push(&buf, (uint8_t)i);
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, len_encoded, {
        ok(end - src == max_bytes);
        int bytes_eq = 1;
        for (size_t i = 0; i < max_bytes; ++i) {
            if (src[i] != (uint8_t)i)
                bytes_eq = 0;
        }
        ok(bytes_eq);
        src = end;
    });

    /* block that does not fit in */
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes + 1; i++)
            ptls_buffer_push(&buf, 1);
        expect_overflow = 1;
    });
    ok(!"fail");

Exit:
    if (ret != 0) {
        if (expect_overflow) {
            ok(ret == PTLS_ERROR_BLOCK_OVERFLOW);
        } else {
            ok(!"fail");
        }
    }
    ptls_buffer_dispose(&buf);
}